

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS
ref_grid_node_list_around
          (REF_GRID ref_grid,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  int iVar1;
  int iVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  REF_INT *pRVar5;
  REF_ADJ_ITEM pRVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  REF_CELL *ppRVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  
  *nnode = 0;
  ppRVar10 = ref_grid->cell + 3;
  lVar11 = 3;
  uVar12 = 0;
  do {
    if (-1 < node) {
      pRVar3 = *ppRVar10;
      pRVar4 = pRVar3->ref_adj;
      if ((node < pRVar4->nnode) && (lVar8 = (long)pRVar4->first[(uint)node], lVar8 != -1)) {
        pRVar6 = pRVar4->item + lVar8;
        iVar9 = pRVar3->node_per;
        do {
          if (0 < iVar9) {
            iVar1 = pRVar6->ref;
            pRVar5 = pRVar3->c2n;
            iVar13 = 0;
            do {
              iVar2 = pRVar5[pRVar3->size_per * iVar1 + iVar13];
              if (iVar2 != node) {
                if (0 < (int)uVar12) {
                  uVar7 = 0;
                  do {
                    if (node_list[uVar7] == iVar2) goto LAB_00111ec3;
                    uVar7 = uVar7 + 1;
                  } while (uVar12 != uVar7);
                }
                if (max_node <= (int)uVar12) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x35f,"ref_grid_node_list_around",7,"max_node too small");
                  return 7;
                }
                node_list[(int)uVar12] = iVar2;
                uVar12 = *nnode + 1;
                *nnode = uVar12;
                iVar9 = pRVar3->node_per;
              }
LAB_00111ec3:
              iVar13 = iVar13 + 1;
            } while (iVar13 < iVar9);
          }
          pRVar6 = pRVar3->ref_adj->item;
          lVar8 = (long)pRVar6[(int)lVar8].next;
          if (lVar8 == -1) break;
          pRVar6 = pRVar6 + lVar8;
        } while( true );
      }
    }
    ppRVar10 = ref_grid->cell + lVar11 + 1;
    lVar11 = lVar11 + 1;
    if (lVar11 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_node_list_around(REF_GRID ref_grid, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves, group;
  REF_CELL ref_cell;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_having_node(ref_cell, node, item, cell) {
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
        already_have_it = REF_FALSE;
        for (haves = 0; haves < *nnode; haves++)
          if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
            already_have_it = REF_TRUE;
            break;
          }
        if (!already_have_it) {
          if (*nnode >= max_node) {
            RSS(REF_INCREASE_LIMIT, "max_node too small");
          }
          node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
          (*nnode)++;
        }
      }
    }
  }

  return REF_SUCCESS;
}